

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

void __thiscall xemmai::ast::t_symbol_get::f_flow(t_symbol_get *this,t_flow *a_flow)

{
  _Rb_tree_header *p_Var1;
  t_object *ptVar2;
  t_variable *ptVar3;
  uint uVar4;
  size_t sVar5;
  t_scope *ptVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  
  sVar5 = this->v_outer;
  ptVar6 = this->v_scope;
  this->v_resolved = sVar5;
  if (ptVar6 != (t_scope *)0x0) {
    ptVar2 = this->v_symbol;
    do {
      p_Var8 = (ptVar6->v_variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var8 != (_Base_ptr)0x0) {
        p_Var1 = &(ptVar6->v_variables)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &p_Var1->_M_header;
        do {
          if (*(t_object **)(p_Var8 + 1) >= ptVar2) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[*(t_object **)(p_Var8 + 1) < ptVar2];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(t_object **)(p_Var7 + 1) <= ptVar2)) {
          this->v_variable = (t_variable *)&p_Var7[1]._M_parent;
          break;
        }
      }
      sVar5 = sVar5 + 1;
      this->v_resolved = sVar5;
      ptVar6 = ptVar6->v_outer;
    } while (ptVar6 != (t_scope *)0x0);
  }
  ptVar3 = this->v_variable;
  if (((ptVar3 != (t_variable *)0x0) && (ptVar3->v_shared == false)) &&
     (uVar4 = (int)ptVar3->v_index - (int)a_flow->v_arguments, -1 < (int)uVar4)) {
    t_block::f_use(a_flow->v_current,(ulong)(uVar4 & 0x7fffffff),false);
    return;
  }
  return;
}

Assistant:

void t_symbol_get::f_flow(t_flow& a_flow)
{
	v_resolved = v_outer;
	for (auto scope = v_scope; scope; scope = scope->v_outer) {
		auto i = scope->v_variables.find(v_symbol);
		if (i != scope->v_variables.end()) {
			v_variable = &i->second;
			break;
		}
		++v_resolved;
	}
	if (!v_variable || v_variable->v_shared) return;
	int i = v_variable->v_index - a_flow.v_arguments;
	if (i >= 0) a_flow.v_current->f_use(i, false);
}